

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCVal2(btok_cvc_t *cvc,octet *cert,size_t cert_len,btok_cvc_t *cvca,octet *date)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  btok_cvc_t *blob;
  
  if ((cvc == (btok_cvc_t *)0x0) || (bVar1 = memIsValid(cvc,0x128), bVar1 != 0)) {
    bVar1 = memIsValid(cvca,0x128);
    eVar2 = 0x6d;
    if ((bVar1 != 0) && ((date == (octet *)0x0 || (bVar1 = memIsValid(date,6), bVar1 != 0)))) {
      if (cvc == (btok_cvc_t *)0x0) {
        blob = (btok_cvc_t *)blobCreate(0x128);
        cvc = blob;
        if (blob == (btok_cvc_t *)0x0) {
          return 0x6e;
        }
      }
      else {
        blob = (btok_cvc_t *)0x0;
      }
      eVar2 = btokCVCUnwrap(cvc,cert,cert_len,cvca->pubkey,cvca->pubkey_len);
      if ((eVar2 == 0) && (eVar2 = btokCVCCheck2(cvc,cvca), eVar2 == 0 && date != (octet *)0x0)) {
        bVar1 = tmDateIsValid2(date);
        if (bVar1 == 0) {
          eVar2 = 0x134;
        }
        else {
          iVar3 = memCmp(cvc->from,date,6);
          if ((iVar3 < 1) && (iVar3 = memCmp(date,cvc->until,6), iVar3 < 1)) {
            eVar2 = 0;
          }
          else {
            eVar2 = 0x136;
          }
        }
      }
      blobClose(blob);
    }
  }
  else {
    eVar2 = 0x6d;
  }
  return eVar2;
}

Assistant:

err_t btokCVCVal2(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const btok_cvc_t* cvca, const octet* date)
{
	err_t code;
	void* stack = 0;
	// входной контроль
	if (!memIsNullOrValid(cvc, sizeof(btok_cvc_t)) || 
		!memIsValid(cvca, sizeof(btok_cvc_t)) ||
		!memIsNullOrValid(date, 6))
		return ERR_BAD_INPUT;
	// выделить память
	if (!cvc)
	{
		stack = blobCreate(sizeof(btok_cvc_t));
		if (!stack)
			return ERR_OUTOFMEMORY;
		cvc = (btok_cvc_t*)stack;
	}
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, cvca->pubkey, cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить соответствие
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить дату
	if (date)
	{
		if (!tmDateIsValid2(date))
			code = ERR_BAD_DATE;
		else if (!tmDateLeq2(cvc->from, date) || !tmDateLeq2(date, cvc->until))
			code = ERR_OUTOFRANGE;
	}
	// завершить
	blobClose(stack);
	return code;
}